

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void francisQR(double *A,int N)

{
  int i_3;
  int iVar1;
  int iVar2;
  double *x;
  double *v;
  double *A_00;
  double *C;
  double *pdVar3;
  ulong uVar4;
  int i;
  int iVar5;
  int iVar6;
  double *pdVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double *local_80;
  int N_2;
  int N_1;
  
  x = (double *)malloc(0x18);
  v = (double *)malloc(0x18);
  lVar12 = (long)N;
  A_00 = (double *)malloc(lVar12 * 0x18);
  C = (double *)malloc(lVar12 * 8);
  uVar8 = N * N;
  dVar25 = A[(ulong)uVar8 - 1] + A[(long)(int)(uVar8 - N) + -2];
  dVar23 = *A;
  dVar24 = A[lVar12];
  *x = ((dVar23 * dVar23 + A[1] * dVar24) - dVar25 * dVar23) +
       (A[(ulong)uVar8 - 1] * A[(long)(int)(uVar8 - N) + -2] -
       A[(long)(int)(uVar8 - N) + -1] * A[(ulong)uVar8 - 2]);
  x[1] = ((dVar23 + A[lVar12 + 1]) - dVar25) * dVar24;
  x[2] = dVar24 * A[N * 2 + 1];
  if (2 < N) {
    iVar5 = N + -1;
    uVar22 = (ulong)(uint)N;
    uVar20 = (ulong)(N - 2U);
    iVar6 = 3;
    uVar18 = 0;
    pdVar3 = A;
    uVar4 = 0xffffffffffffffff;
    local_80 = A;
    do {
      iVar19 = (int)uVar4;
      uVar10 = 0;
      if (0 < iVar19) {
        uVar10 = uVar4 & 0xffffffff;
      }
      iVar9 = (int)uVar10;
      iVar1 = iVar5;
      if (iVar6 < iVar5) {
        iVar1 = iVar6;
      }
      dVar23 = house(x,3,v);
      uVar21 = uVar4 + 4;
      lVar12 = 0;
      pdVar7 = pdVar3;
      uVar11 = uVar18;
      do {
        lVar15 = lVar12;
        uVar14 = uVar10;
        if ((long)uVar4 < (long)uVar22) {
          do {
            *(double *)((long)A_00 + (lVar15 >> 0x1d)) = pdVar7[uVar14];
            uVar14 = uVar14 + 1;
            lVar15 = lVar15 + 0x300000000;
          } while (uVar14 < uVar22);
        }
        uVar11 = uVar11 + 1;
        pdVar7 = pdVar7 + uVar22;
        lVar12 = lVar12 + 0x100000000;
      } while (uVar11 < uVar21);
      mmult(A_00,v,C,N - iVar9,3,1);
      if (N - iVar9 != 0 && iVar9 <= N) {
        uVar11 = 0;
        do {
          C[uVar11] = C[uVar11] * dVar23;
          uVar11 = uVar11 + 1;
        } while ((uint)(N - iVar9) != uVar11);
      }
      mmult(v,C,A_00,3,1,N - iVar9);
      iVar2 = 0;
      pdVar7 = pdVar3;
      uVar11 = uVar18;
      do {
        uVar14 = uVar10;
        iVar13 = iVar2;
        if ((long)uVar4 < (long)uVar22) {
          do {
            pdVar7[uVar14] = pdVar7[uVar14] - A_00[iVar13];
            uVar14 = uVar14 + 1;
            iVar13 = iVar13 + 1;
          } while (uVar14 < uVar22);
        }
        uVar11 = uVar11 + 1;
        pdVar7 = pdVar7 + uVar22;
        iVar2 = iVar2 + (N - iVar9);
      } while (uVar11 < uVar21);
      uVar8 = iVar19 + 5;
      if ((long)iVar5 <= (long)uVar21) {
        uVar8 = N;
      }
      if (0 < (int)uVar8) {
        lVar12 = 0;
        uVar10 = 0;
        pdVar7 = local_80;
        do {
          lVar16 = 0;
          lVar15 = lVar12;
          do {
            *(double *)((long)A_00 + (lVar15 >> 0x1d)) = pdVar7[lVar16];
            lVar15 = lVar15 + 0x100000000;
            lVar17 = lVar16 + uVar18;
            lVar16 = lVar16 + 1;
          } while (lVar17 + 1U < uVar21);
          uVar10 = uVar10 + 1;
          pdVar7 = pdVar7 + uVar22;
          lVar12 = lVar12 + 0x300000000;
        } while (uVar10 != iVar1 + 1U);
      }
      mmult(A_00,v,C,uVar8,3,1);
      if (0 < (int)uVar8) {
        uVar10 = 0;
        do {
          C[uVar10] = C[uVar10] * dVar23;
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      mmult(C,v,A_00,uVar8,1,3);
      if (0 < (int)uVar8) {
        lVar12 = 0;
        uVar10 = 0;
        pdVar7 = local_80;
        do {
          lVar16 = 0;
          lVar15 = lVar12;
          do {
            pdVar7[lVar16] = pdVar7[lVar16] - *(double *)((long)A_00 + (lVar15 >> 0x1d));
            lVar15 = lVar15 + 0x100000000;
            lVar17 = lVar16 + uVar18;
            lVar16 = lVar16 + 1;
          } while (lVar17 + 1U < uVar21);
          uVar10 = uVar10 + 1;
          pdVar7 = pdVar7 + uVar22;
          lVar12 = lVar12 + 0x300000000;
        } while (uVar10 != iVar1 + 1U);
      }
      *x = A[uVar4 + (long)((iVar19 + 2) * N) + 1];
      x[1] = A[uVar4 + (long)((iVar19 + 3) * N) + 1];
      if ((long)uVar4 < (long)(N + -4)) {
        x[2] = A[uVar21 * uVar22 + uVar4 + 1];
      }
      uVar18 = uVar18 + 1;
      iVar6 = iVar6 + 1;
      pdVar3 = pdVar3 + uVar22;
      local_80 = local_80 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar18 != uVar20);
    dVar23 = house(x,2,v);
    lVar15 = (long)(N + -3);
    lVar16 = (long)(int)(N - 2U);
    pdVar3 = A + lVar16 * uVar22;
    iVar6 = -1;
    lVar12 = lVar16;
    do {
      pdVar7 = A_00 + (long)iVar6 + 1;
      lVar17 = lVar15;
      do {
        *pdVar7 = pdVar3[lVar17];
        lVar17 = lVar17 + 1;
        pdVar7 = pdVar7 + 2;
      } while (lVar17 < (long)uVar22);
      lVar12 = lVar12 + 1;
      pdVar3 = pdVar3 + uVar22;
      iVar6 = iVar6 + 1;
    } while (lVar12 < (long)uVar22);
    lVar12 = 0;
    pdVar3 = A_00;
    do {
      C[lVar12] = 0.0;
      dVar24 = 0.0;
      lVar17 = 0;
      do {
        dVar24 = dVar24 + pdVar3[lVar17] * v[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 2);
      C[lVar12] = dVar24;
      lVar12 = lVar12 + 1;
      pdVar3 = pdVar3 + 2;
    } while (lVar12 != 3);
    lVar12 = 0;
    do {
      C[lVar12] = C[lVar12] * dVar23;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar12 = 0;
    pdVar3 = A_00;
    do {
      dVar24 = v[lVar12];
      lVar17 = 0;
      do {
        pdVar3[lVar17] = 0.0;
        pdVar3[lVar17] = C[lVar17] * dVar24 + 0.0;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar12 = lVar12 + 1;
      pdVar3 = pdVar3 + 3;
    } while (lVar12 != 2);
    pdVar3 = A + lVar16 * uVar22;
    iVar6 = -2;
    lVar12 = lVar15;
    lVar17 = lVar16;
    iVar19 = iVar6;
    do {
      do {
        pdVar3[lVar12] = pdVar3[lVar12] - A_00[(long)iVar6 + 2];
        lVar12 = lVar12 + 1;
        iVar6 = iVar6 + 1;
      } while (lVar12 < (long)uVar22);
      lVar17 = lVar17 + 1;
      pdVar3 = pdVar3 + uVar22;
      iVar6 = iVar19 + 3;
      lVar12 = lVar15;
      iVar19 = iVar6;
    } while (lVar17 < (long)uVar22);
    if (iVar5 < N) {
      iVar5 = N;
    }
    uVar4 = 1;
    if (1 < N) {
      uVar4 = (ulong)(uint)N;
    }
    lVar12 = 0;
    do {
      memcpy((void *)((long)A_00 + lVar12),A + (int)uVar20,(ulong)((iVar5 - N) + 1) * 8 + 8);
      uVar20 = (ulong)(uint)((int)uVar20 + N);
      lVar12 = lVar12 + 0x10;
    } while (uVar4 * 0x10 != lVar12);
    mmult(A_00,v,C,N,2,1);
    uVar4 = 0;
    do {
      C[uVar4] = C[uVar4] * dVar23;
      uVar4 = uVar4 + 1;
    } while (uVar22 != uVar4);
    mmult(C,v,A_00,N,1,2);
    uVar4 = 1;
    if (1 < N) {
      uVar4 = (ulong)(uint)N;
    }
    iVar5 = -1;
    uVar18 = 0;
    lVar12 = lVar16;
    iVar6 = iVar5;
    do {
      do {
        A[lVar12] = A[lVar12] - A_00[(long)iVar5 + 1];
        lVar12 = lVar12 + 1;
        iVar5 = iVar5 + 1;
      } while (lVar12 < (long)uVar22);
      uVar18 = uVar18 + 1;
      A = A + uVar22;
      iVar5 = iVar6 + 2;
      lVar12 = lVar16;
      iVar6 = iVar5;
    } while (uVar18 != uVar4);
    free(x);
    free(v);
    free(A_00);
    free(C);
    return;
  }
  return;
}

Assistant:

void francisQR(double *A,int N) {
	int m,n,k,q,r,t,u,i,j;
	double s,t2,beta;
	double *x,*v,*AT,*w;
	int NN;
	/*
	 * Reference - Algorithm 7.5.1 Golub,van Loan Matrix Computations 3rd Edition
	 */ 
	x = (double*) malloc(sizeof(double) * 3);
	v = (double*) malloc(sizeof(double) * 3);
	AT = (double*) malloc(sizeof(double) * 3 * N);
	w = (double*) malloc(sizeof(double) * N);
	n = N-1;
	m = n-1;
	NN = N*N;
	
	s = A[NN-1] + A[NN-N-2];
	t2 = A[NN-1] * A[NN-N-2] - A[NN-2] * A[NN-N-1];
	
	x[0] = A[0]*A[0] + A[1]*A[N] - s*A[0] + t2;
	x[1] = A[N]*(A[0] + A[N+1] - s);
	x[2] = A[N] * A[N+N+1];
	if (N <= 2) {
		return;
	}
	
	for (k = -1; k < N - 3;++k) {
		
		beta = house(x,3,v);
		//mdisplay(x,3,1);
		if (k > 0) {
			q = k;
		} else {
			q = 0;
		}
		
		//printf("q %d \n",q);
		for (i=k+1; i < k+4; i++) {
			t = i * N;
			u = 0;
			for (j=q; j < N; j++) {
				AT[u+i-k-1] = A[j+t];
				u+=3;		
			}
		}
		
		mmult(AT,v,w,N-q,3,1);
		scale(w,N-q,1,beta);
		mmult(v,w,AT,3,1,N-q);
		
		for (i=k+1; i < k+4; i++) {
			t = i * N;
			for (j=q; j < N; j++) {
				A[t+j] -= AT[(i-k-1)*(N-q) + j - q];
			}
		}
		//mdisplay(A,N,N);
		if (k+4 >= n) {
			r = N;
		} else {
			r = k+4+1;
		}
		//printf("r %d \n",r);
		for (i=0; i < r; i++) {
			t = i * N;
			u = i * 3;
			for (j=k+1; j < k+4; j++) {
				AT[u+j-k-1] = A[t+j];
			}
		}
		
		mmult(AT,v,w,r,3,1);
		scale(w,r,1,beta);
		mmult(w,v,AT,r,1,3);
		//mdisplay(AT,N,N-k-1);
		
		for (i=0; i < r; i++) {
			t = i * N;
			u = i * 3;
			for (j=k+1; j < k+4; j++) {
				A[t+j] -= AT[u+j-k-1];
			}
		}
		//mdisplay(A,N,N);
		x[0] = A[N*(k+2) + k+1];
		x[1] = A[N*(k+3) + k+1];
		
		if (k < n-3) {
			x[2] = A[N*(k+4) + k+1];
		} 
		//mdisplay(x,3,1);
		
	}
	//mdisplay(x,2,1);
	beta = house(x,2,v);
	
	for (i=n-1; i < N; i++) {
		t = i * N;
		u = 0;
		for (j=n-2; j < N; j++) {
			AT[u+i-n+1] = A[j+t];
			u+=2;		
		}
	}
	
	mmult(AT,v,w,3,2,1);
	scale(w,3,1,beta);
	mmult(v,w,AT,2,1,3);
	for (i=n-1; i < N; i++) {
		t = i * N;
		for (j=n-2; j < N; j++) {
			A[t+j] -= AT[(i-n+1)*3 + j - n + 2];
		}
	}
	
	for (i=0; i < N; i++) {
		t = i * N;
		u = i * 2;
		for (j=n-1; j < N; j++) {
			AT[u+j-n+1] = A[t+j];
		}
	}
	
	mmult(AT,v,w,N,2,1);
	scale(w,N,1,beta);
	mmult(w,v,AT,N,1,2);
		//mdisplay(AT,N,N-k-1);
		
	for (i=0; i < N; i++) {
		t = i * N;
		u = i * 2;
		for (j=n-1; j < N; j++) {
			A[t+j] -= AT[u+j-n+1];
		}
	}
	
	
	free(x);
	free(v);
	free(AT);
	free(w);
	
}